

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.cpp
# Opt level: O0

void __thiscall index::set_word_end(index *this,wstring *word)

{
  wchar_t wVar1;
  bool bVar2;
  pointer ppVar3;
  wchar_t *pwVar4;
  wstring *in_RSI;
  _Node_iterator<std::pair<const_wchar_t,_character>,_false,_false> iter;
  pair<std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>_>
  range;
  key_type *in_stack_ffffffffffffffb8;
  wstring *in_stack_ffffffffffffffc0;
  _Node_iterator_base<std::pair<const_wchar_t,_character>,_false> local_28;
  pair<std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>_>
  local_20;
  wstring *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::wstring::operator[]((ulong)in_RSI);
  local_20 = std::
             unordered_multimap<wchar_t,_character,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_character>_>_>
             ::equal_range((unordered_multimap<wchar_t,_character,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_character>_>_>
                            *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_28 = local_20.first.super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>.
             _M_cur;
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&local_28,
                       &local_20.second.
                        super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>);
    if (!bVar2) break;
    ppVar3 = std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false> *)
                        0x11750e);
    wVar1 = (ppVar3->second).value;
    pwVar4 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)local_10);
    if (wVar1 == *pwVar4) {
      ppVar3 = std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>::
               operator->((_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false> *)
                          0x117540);
      (ppVar3->second).is_word_end = true;
      in_stack_ffffffffffffffc0 = local_10;
      ppVar3 = std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>::
               operator->((_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false> *)
                          0x117558);
      std::__cxx11::wstring::operator=((wstring *)&(ppVar3->second).word,in_stack_ffffffffffffffc0);
    }
    std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false> *)
               in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void index::set_word_end(const std::wstring& word)
{
    auto range = index_.equal_range(word[level_ - 1]);
    for (auto iter = range.first; iter != range.second; ++iter)
    {
        if (iter->second.value == word[level_])
        {
            iter->second.is_word_end = true;
            iter->second.word = word;
        }
    }
}